

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_hub.cpp
# Opt level: O1

void G_LeavingHub(int mode,cluster_info_t *cluster,wbstartstruct_t *wbs)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  char *pcVar7;
  long lVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  FHubInfo *pFVar14;
  int *piVar15;
  ulong uVar16;
  
  uVar5 = hubdata.Count;
  if ((cluster->flags & 1) != 0) {
    if (hubdata.Count == 0) {
      uVar11 = 0;
    }
    else {
      uVar10 = 0;
      pFVar14 = hubdata.Array;
      do {
        if (pFVar14->finished_ep == level.levelnum) {
          pFVar14->finished_ep = wbs->finished_ep;
          pFVar14->maxkills = wbs->maxkills;
          pFVar14->maxsecret = wbs->maxsecret;
          pFVar14->maxitems = wbs->maxitems;
          pFVar14->maxfrags = wbs->maxfrags;
          memcpy(pFVar14->plyr,wbs->plyr,0x1c0);
          uVar11 = uVar10;
          break;
        }
        uVar10 = uVar10 + 1;
        pFVar14 = pFVar14 + 1;
        uVar11 = hubdata.Count;
      } while (hubdata.Count != uVar10);
    }
    if (uVar11 == uVar5) {
      TArray<FHubInfo,_FHubInfo>::Grow(&hubdata,1);
      uVar6 = (ulong)hubdata.Count;
      hubdata.Count = hubdata.Count + 1;
      pFVar14 = hubdata.Array + uVar6;
      pFVar14->finished_ep = wbs->finished_ep;
      pFVar14->maxkills = wbs->maxkills;
      pFVar14->maxsecret = wbs->maxsecret;
      pFVar14->maxitems = wbs->maxitems;
      pFVar14->maxfrags = wbs->maxfrags;
      memcpy(pFVar14->plyr,wbs->plyr,0x1c0);
    }
    pFVar14 = hubdata.Array;
    hubdata.Array[uVar11].finished_ep = level.levelnum;
    if ((multiplayer == false) && (deathmatch.Value == 0)) {
      pFVar14[uVar11].plyr[0].skills = level.killed_monsters;
      pFVar14[uVar11].plyr[0].sitems = level.found_items;
      pFVar14[uVar11].plyr[0].ssecret = level.found_secrets;
    }
    if (mode == 0) {
      return;
    }
    wbs->maxsecret = 0;
    wbs->maxkills = 0;
    wbs->maxitems = 0;
    lVar8 = 0;
    do {
      *(undefined4 *)((long)wbs->plyr[0].frags + lVar8 + -8) = 0;
      *(undefined8 *)((long)wbs->plyr[0].frags + lVar8 + -0x10) = 0;
      lVar8 = lVar8 + 0x38;
    } while (lVar8 != 0x1c0);
    uVar6 = (ulong)hubdata.Count;
    if (uVar6 != 0) {
      iVar13 = wbs->maxkills;
      iVar12 = wbs->maxitems;
      iVar9 = wbs->maxsecret;
      piVar15 = &pFVar14->plyr[0].ssecret;
      uVar16 = 0;
      do {
        iVar2 = pFVar14[uVar16].maxkills;
        iVar3 = pFVar14[uVar16].maxitems;
        iVar4 = pFVar14[uVar16].maxsecret;
        lVar8 = 0;
        do {
          piVar1 = (int *)((long)wbs->plyr[0].frags + lVar8 + -0xc);
          *piVar1 = *piVar1 + *(int *)((long)piVar15 + lVar8 + -4);
          piVar1 = (int *)((long)wbs->plyr[0].frags + lVar8 + -0x10);
          *piVar1 = *piVar1 + *(int *)((long)piVar15 + lVar8 + -8);
          piVar1 = (int *)((long)wbs->plyr[0].frags + lVar8 + -8);
          *piVar1 = *piVar1 + *(int *)((long)piVar15 + lVar8);
          lVar8 = lVar8 + 0x38;
        } while (lVar8 != 0x1c0);
        iVar13 = iVar13 + iVar2;
        iVar12 = iVar12 + iVar3;
        iVar9 = iVar9 + iVar4;
        uVar16 = uVar16 + 1;
        piVar15 = piVar15 + 0x75;
      } while (uVar16 != uVar6);
      wbs->maxkills = iVar13;
      wbs->maxitems = iVar12;
      wbs->maxsecret = iVar9;
    }
    pcVar7 = (cluster->ClusterName).Chars;
    if (*(int *)(pcVar7 + -0xc) != 0) {
      if ((cluster->flags & 0x40) == 0) {
        FString::operator=(&level.LevelName,&cluster->ClusterName);
      }
      else {
        pcVar7 = FStringTable::operator()(&GStrings,pcVar7);
        FString::operator=(&level.LevelName,pcVar7);
      }
    }
  }
  if ((mode != 0) && (hubdata.Count != 0)) {
    hubdata.Count = 0;
  }
  return;
}

Assistant:

void G_LeavingHub(int mode, cluster_info_t * cluster, wbstartstruct_t * wbs)
{
	unsigned int i,j;

	if (cluster->flags & CLUSTER_HUB)
	{
		for(i=0;i<hubdata.Size();i++)
		{
			if (hubdata[i].finished_ep==level.levelnum)
			{
				hubdata[i]=*wbs;
				break;
			}
		}
		if (i==hubdata.Size())
		{
			hubdata[hubdata.Reserve(1)] = *wbs;
		}

		hubdata[i].finished_ep=level.levelnum;
		if (!multiplayer && !deathmatch)
		{
			// The player counters don't work in hubs
			hubdata[i].plyr[0].skills=level.killed_monsters;
			hubdata[i].plyr[0].sitems=level.found_items;
			hubdata[i].plyr[0].ssecret=level.found_secrets;
		}


		if (mode!=FINISH_SameHub)
		{
			wbs->maxkills=wbs->maxitems=wbs->maxsecret=0;
			for(i=0;i<MAXPLAYERS;i++)
			{
				wbs->plyr[i].sitems=wbs->plyr[i].skills=wbs->plyr[i].ssecret=0;
			}

			for(i=0;i<hubdata.Size();i++)
			{
				wbs->maxkills += hubdata[i].maxkills;
				wbs->maxitems += hubdata[i].maxitems;
				wbs->maxsecret += hubdata[i].maxsecret;
				for(j=0;j<MAXPLAYERS;j++)
				{
					wbs->plyr[j].sitems += hubdata[i].plyr[j].sitems;
					wbs->plyr[j].skills += hubdata[i].plyr[j].skills;
					wbs->plyr[j].ssecret += hubdata[i].plyr[j].ssecret;
				}
			}
			if (cluster->ClusterName.IsNotEmpty()) 
			{
				if (cluster->flags & CLUSTER_LOOKUPNAME)
				{
					level.LevelName = GStrings(cluster->ClusterName);
				}
				else
				{
					level.LevelName = cluster->ClusterName;
				}
			}
		}
	}
	if (mode!=FINISH_SameHub) hubdata.Clear();
}